

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddLinkLibraryForTarget(cmMakefile *this,string *target,string *lib,LinkLibraryType llt)

{
  bool bVar1;
  TargetType TVar2;
  cmGlobalGenerator *this_00;
  cmTarget *this_01;
  char *pcVar3;
  pointer ppVar4;
  ostream *poVar5;
  string local_380;
  ostringstream local_360 [8];
  ostringstream e_1;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream e;
  cmTarget *tgt;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_30;
  iterator i;
  LinkLibraryType llt_local;
  string *lib_local;
  string *target_local;
  cmMakefile *this_local;
  
  i.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur._4_4_ = llt;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
       ::find(&this->Targets,target);
  tgt = (cmTarget *)
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
        ::end(&this->Targets);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                      *)&tgt);
  if (bVar1) {
    this_00 = GetGlobalGenerator(this);
    this_01 = cmGlobalGenerator::FindTarget(this_00,lib,false);
    if ((((this_01 != (cmTarget *)0x0) &&
         (TVar2 = cmTarget::GetType(this_01), TVar2 != STATIC_LIBRARY)) &&
        (TVar2 = cmTarget::GetType(this_01), TVar2 != SHARED_LIBRARY)) &&
       ((TVar2 = cmTarget::GetType(this_01), TVar2 != INTERFACE_LIBRARY &&
        (bVar1 = cmTarget::IsExecutableWithExports(this_01), !bVar1)))) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar5 = std::operator<<((ostream *)local_1b8,"Target \"");
      poVar5 = std::operator<<(poVar5,(string *)lib);
      poVar5 = std::operator<<(poVar5,"\" of type ");
      TVar2 = cmTarget::GetType(this_01);
      pcVar3 = cmTarget::GetTargetTypeName(TVar2);
      poVar5 = std::operator<<(poVar5,pcVar3);
      poVar5 = std::operator<<(poVar5," may not be linked into another target.  ");
      poVar5 = std::operator<<(poVar5,"One may link only to STATIC or SHARED libraries, or ");
      std::operator<<(poVar5,"to executables with the ENABLE_EXPORTS property set.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                           *)&local_30);
    cmTarget::AddLinkLibrary
              (&ppVar4->second,this,target,lib,
               i.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               ._M_cur._4_4_);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_360);
    poVar5 = std::operator<<((ostream *)local_360,"Attempt to add link library \"");
    poVar5 = std::operator<<(poVar5,(string *)lib);
    poVar5 = std::operator<<(poVar5,"\" to target \"");
    poVar5 = std::operator<<(poVar5,(string *)target);
    std::operator<<(poVar5,"\" which is not built in this directory.");
    std::__cxx11::ostringstream::str();
    IssueMessage(this,FATAL_ERROR,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::ostringstream::~ostringstream(local_360);
  }
  return;
}

Assistant:

void cmMakefile::AddLinkLibraryForTarget(const std::string& target,
                                         const std::string& lib,
                                         cmTarget::LinkLibraryType llt)
{
  cmTargets::iterator i = this->Targets.find(target);
  if ( i != this->Targets.end())
    {
    cmTarget* tgt = this->GetGlobalGenerator()->FindTarget(lib);
    if(tgt)
      {
      // if it is not a static or shared library then you can not link to it
      if(!((tgt->GetType() == cmTarget::STATIC_LIBRARY) ||
           (tgt->GetType() == cmTarget::SHARED_LIBRARY) ||
           (tgt->GetType() == cmTarget::INTERFACE_LIBRARY) ||
           tgt->IsExecutableWithExports()))
        {
        std::ostringstream e;
        e << "Target \"" << lib << "\" of type "
          << cmTarget::GetTargetTypeName(tgt->GetType())
          << " may not be linked into another target.  "
          << "One may link only to STATIC or SHARED libraries, or "
          << "to executables with the ENABLE_EXPORTS property set.";
        this->IssueMessage(cmake::FATAL_ERROR, e.str());
        }
      }
    i->second.AddLinkLibrary( *this, target, lib, llt );
    }
  else
    {
    std::ostringstream e;
    e << "Attempt to add link library \""
      << lib << "\" to target \""
      << target << "\" which is not built in this directory.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
}